

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O0

void __thiscall
jaegertracing::sampling_manager::thrift::OperationSamplingStrategy::write
          (OperationSamplingStrategy *this)

{
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  
  write((OperationSamplingStrategy *)(&this->field_0x0 + *(long *)(*(long *)this + -0x28)),in_ESI,
        in_RDX,in_RCX);
  return;
}

Assistant:

uint32_t OperationSamplingStrategy::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("OperationSamplingStrategy");

  xfer += oprot->writeFieldBegin("operation", ::apache::thrift::protocol::T_STRING, 1);
  xfer += oprot->writeString(this->operation);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("probabilisticSampling", ::apache::thrift::protocol::T_STRUCT, 2);
  xfer += this->probabilisticSampling.write(oprot);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}